

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O2

void __thiscall cmInstallFilesCommand::FinalPass(cmInstallFilesCommand *this)

{
  string *regexp;
  size_type sVar1;
  pointer pbVar2;
  string *psVar3;
  string *this_00;
  _Alloc_hider _Var4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string testf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_d8;
  string local_d0;
  char *local_b0;
  undefined8 local_a8;
  char local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if (this->IsFilesForm == false) {
    local_b0 = local_a0;
    local_a8 = 0;
    local_a0[0] = '\0';
    regexp = (this->FinalArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->FinalArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar2 - (long)regexp) < 0x21) {
      local_f8._M_dataplus._M_p = (pointer)0x0;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_allocated_capacity = 0;
      psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      cmSystemTools::Glob(psVar3,regexp,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_f8);
      for (_Var4._M_p = local_f8._M_dataplus._M_p; _Var4._M_p != (pointer)local_f8._M_string_length;
          _Var4._M_p = _Var4._M_p + 0x20) {
        FindInstallSource_abi_cxx11_(&local_d0,this,*(char **)_Var4._M_p);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Files
                   ,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
    }
    else {
      local_d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Files;
      psVar3 = regexp;
      while (psVar3 = psVar3 + 1, psVar3 != pbVar2) {
        cmsys::SystemTools::GetFilenamePath(&local_d0,psVar3);
        sVar1 = local_d0._M_string_length;
        std::__cxx11::string::~string((string *)&local_d0);
        if (sVar1 == 0) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_f8,psVar3);
          std::operator+(&local_d0,&local_f8,regexp);
          std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          this_00 = &local_f8;
        }
        else {
          cmsys::SystemTools::GetFilenamePath(&local_50,psVar3);
          std::operator+(&local_90,&local_50,"/");
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_70,psVar3);
          std::operator+(&local_f8,&local_90,&local_70);
          std::operator+(&local_d0,&local_f8,regexp);
          std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          this_00 = &local_50;
        }
        std::__cxx11::string::~string((string *)this_00);
        FindInstallSource_abi_cxx11_(&local_d0,this,local_b0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_d8,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        pbVar2 = (this->FinalArgs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    CreateInstallGenerator(this);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return;
}

Assistant:

void cmInstallFilesCommand::FinalPass()
{
  // No final pass for "FILES" form of arguments.
  if (this->IsFilesForm) {
    return;
  }

  std::string testf;
  std::string const& ext = this->FinalArgs[0];

  // two different options
  if (this->FinalArgs.size() > 1) {
    // now put the files into the list
    std::vector<std::string>::iterator s = this->FinalArgs.begin();
    ++s;
    // for each argument, get the files
    for (; s != this->FinalArgs.end(); ++s) {
      // replace any variables
      std::string const& temps = *s;
      if (!cmSystemTools::GetFilenamePath(temps).empty()) {
        testf = cmSystemTools::GetFilenamePath(temps) + "/" +
          cmSystemTools::GetFilenameWithoutLastExtension(temps) + ext;
      } else {
        testf = cmSystemTools::GetFilenameWithoutLastExtension(temps) + ext;
      }

      // add to the result
      this->Files.push_back(this->FindInstallSource(testf.c_str()));
    }
  } else // reg exp list
  {
    std::vector<std::string> files;
    std::string const& regex = this->FinalArgs[0];
    cmSystemTools::Glob(this->Makefile->GetCurrentSourceDirectory(), regex,
                        files);

    std::vector<std::string>::iterator s = files.begin();
    // for each argument, get the files
    for (; s != files.end(); ++s) {
      this->Files.push_back(this->FindInstallSource(s->c_str()));
    }
  }

  this->CreateInstallGenerator();
}